

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvm.cpp
# Opt level: O0

Value * Kvm::loadProc(Kvm *vm,Value *args)

{
  byte bVar1;
  Value *pVVar2;
  KatException *this;
  Value *in_RCX;
  void *extraout_RDX;
  void *__buf;
  void *extraout_RDX_00;
  bool local_2a1;
  Kvm *local_280;
  Value *result;
  Value *v;
  undefined1 local_268 [8];
  string msg;
  long local_238;
  ifstream in;
  char *filename;
  String *s;
  Value *args_local;
  Kvm *vm_local;
  
  pVVar2 = car(args);
  std::ifstream::ifstream(&local_238,pVVar2[1]._vptr_Value,8);
  bVar1 = std::ios::operator!((ios *)((long)&local_238 + *(long *)(local_238 + -0x18)));
  if ((bVar1 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_268,"could not load file \"",(allocator<char> *)((long)&v + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&v + 7));
    std::__cxx11::string::append(local_268);
    std::__cxx11::string::append(local_268);
    this = (KatException *)__cxa_allocate_exception(0x10);
    anon_unknown.dwarf_ebf5::KatException::KatException(this,(string *)local_268);
    __cxa_throw(this,&(anonymous_namespace)::KatException::typeinfo,
                anon_unknown.dwarf_ebf5::KatException::~KatException);
  }
  local_280 = (Kvm *)0x0;
  std::ios_base::unsetf((ios_base *)((long)&local_238 + *(long *)(local_238 + -0x18)),_S_skipws);
  __buf = extraout_RDX;
  while( true ) {
    pVVar2 = (Value *)read(vm,(int)&local_238,__buf,(size_t)in_RCX);
    local_2a1 = false;
    in_RCX = pVVar2;
    if (pVVar2 != (Value *)0x0) {
      local_2a1 = std::ios::operator_cast_to_bool
                            ((ios *)((long)&local_238 + *(long *)(local_238 + -0x18)));
    }
    if (local_2a1 == false) break;
    local_280 = (Kvm *)eval(vm,pVVar2,vm->GLOBAL_ENV);
    __buf = extraout_RDX_00;
    if (local_280 == (Kvm *)0x0) {
      vm_local = (Kvm *)0x0;
LAB_001191cf:
      std::ifstream::~ifstream(&local_238);
      return (Value *)vm_local;
    }
  }
  vm_local = local_280;
  goto LAB_001191cf;
}

Assistant:

const Value* Kvm::loadProc(Kvm *vm, const Value *args)
{
    const String *s = static_cast<const String *>(car(args));
    auto filename = s->value_;

    std::ifstream in(filename);

    if (!in)
    {
        std::string msg("could not load file \"");
        msg.append(filename);
        msg.append("\"");
        throw KatException(msg);
    }

    const Value *v = nullptr;
    const Value *result = nullptr;

    in.unsetf(std::ios_base::skipws);
    while ((v = vm->read(in)) && in)
    {
        result = vm->eval(v, vm->GLOBAL_ENV);
        if (!result) return nullptr;
    }
    return result;
}